

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

string * __thiscall
pfederc::Token::toString_abi_cxx11_(string *__return_storage_ptr__,Token *this,Lexer *lexer)

{
  TokenType TVar1;
  string *psVar2;
  allocator<char> local_22;
  allocator<char> local_21;
  Lexer *local_20;
  Lexer *lexer_local;
  Token *this_local;
  
  local_20 = lexer;
  lexer_local = (Lexer *)this;
  this_local = (Token *)__return_storage_ptr__;
  TVar1 = getType(this);
  if (TVar1 == TOK_KW_TRUE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"True",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else if (TVar1 == TOK_KW_FALSE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"False",&local_22);
    std::allocator<char>::~allocator(&local_22);
  }
  else {
    psVar2 = Lexer::getFileContent_abi_cxx11_(local_20);
    getPosition(this);
    getPosition(this);
    getPosition(this);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)psVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Token::toString(const Lexer &lexer) const noexcept {
	switch(getType()) {
	case TokenType::TOK_KW_TRUE:
		return "True";
	case TokenType::TOK_KW_FALSE:
		return "False";
	default:
  	return lexer.getFileContent().substr(getPosition().startIndex,
  	  getPosition().endIndex - getPosition().startIndex + 1);
	}
}